

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::draw_pick(Mesh *this,int *pickID,bool transformed)

{
  bool bVar1;
  pointer pFVar2;
  HalfedgeIter *pHVar3;
  pointer pHVar4;
  VertexIter *pVVar5;
  EdgeIter *pEVar6;
  reference this_00;
  pointer pVVar7;
  byte in_DL;
  size_type __n;
  long in_RDI;
  VertexIter v_1;
  int i;
  Vector3D r2;
  Vector3D q2;
  Vector3D p2;
  Vector3D b2;
  Vector3D a2;
  Vector3D r1;
  Vector3D q1;
  Vector3D p1;
  Vector3D b1;
  Vector3D a1;
  HalfedgeIter h2;
  HalfedgeIter h1;
  HalfedgeIter h;
  Vector3D c;
  FaceIter f;
  VertexIter v;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> originalPositions;
  HalfedgeMesh *in_stack_fffffffffffffd38;
  Vector3D *in_stack_fffffffffffffd40;
  value_type *in_stack_fffffffffffffd48;
  VertexIter in_stack_fffffffffffffd50;
  HalfedgeIter *in_stack_fffffffffffffd58;
  Mesh *in_stack_fffffffffffffd60;
  _Self local_200;
  _Self local_1f8;
  int local_1ec;
  _List_node_base *local_1e8;
  _List_node_base *local_1e0;
  _List_node_base *local_1d8;
  _List_node_base *local_1d0;
  _List_node_base *local_1c8;
  Vector3D local_1c0;
  Vector3D local_1a8;
  Vector3D local_190;
  Vector3D local_178;
  Vector3D local_160;
  Vector3D local_148;
  undefined1 local_130 [8];
  Vertex *in_stack_fffffffffffffed8;
  Vector3D *in_stack_fffffffffffffee8;
  Vector3D *in_stack_fffffffffffffef0;
  Vector3D *in_stack_fffffffffffffef8;
  Vector3D *in_stack_ffffffffffffff00;
  Vector3D *in_stack_ffffffffffffff08;
  Halfedge *in_stack_ffffffffffffff10;
  Vector3D local_e8;
  _List_node_base *local_d0;
  _List_node_base *local_c8;
  _Self local_c0;
  undefined1 local_b8 [24];
  _Self local_a0;
  _Self local_98;
  _List_node_base *local_90;
  double local_70;
  Vector3D local_68;
  _Self local_50;
  _Self local_48 [3];
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> local_30;
  byte local_11;
  
  local_11 = in_DL & 1;
  std::
  map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
  ::clear((map<int,_CMU462::HalfedgeElement_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::HalfedgeElement_*>_>_>
           *)0x201bce);
  if ((*(byte *)(in_RDI + 0xe9) & 1) == 0) {
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::vector
              ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)0x201bf1);
    if ((local_11 & 1) != 0) {
      glPushMatrix();
      glTranslatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x10) >> 0x20),
                            (float)*(double *)(in_RDI + 0x10)),
                   CONCAT44((int)((ulong)*(double *)(in_RDI + 0x18) >> 0x20),
                            (float)*(double *)(in_RDI + 0x18)),
                   CONCAT44((int)((ulong)*(double *)(in_RDI + 0x20) >> 0x20),
                            (float)*(double *)(in_RDI + 0x20)));
      glRotatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x28) >> 0x20),
                         (float)*(double *)(in_RDI + 0x28)),0x3f800000,0);
      glRotatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x30) >> 0x20),
                         (float)*(double *)(in_RDI + 0x30)),0,0x3f800000);
      glRotatef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x38) >> 0x20),
                         (float)*(double *)(in_RDI + 0x38)),0,0,0x3f800000);
      glScalef(CONCAT44((int)((ulong)*(double *)(in_RDI + 0x40) >> 0x20),
                        (float)*(double *)(in_RDI + 0x40)),
               CONCAT44((int)((ulong)*(double *)(in_RDI + 0x48) >> 0x20),
                        (float)*(double *)(in_RDI + 0x48)),
               CONCAT44((int)((ulong)*(double *)(in_RDI + 0x50) >> 0x20),
                        (float)*(double *)(in_RDI + 0x50)));
      local_48[0]._M_node =
           (_List_node_base *)HalfedgeMesh::verticesBegin(in_stack_fffffffffffffd38);
      while( true ) {
        local_50._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(in_stack_fffffffffffffd38);
        bVar1 = std::operator!=(local_48,&local_50);
        if (!bVar1) break;
        std::_List_iterator<CMU462::Vertex>::operator->
                  ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffd40);
        std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::push_back
                  ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
                   in_stack_fffffffffffffd50._M_node,in_stack_fffffffffffffd48);
        pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                           ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffd40);
        local_70 = (double)pVVar7->offset;
        std::_List_iterator<CMU462::Vertex>::operator->
                  ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffd40);
        Vertex::normal(in_stack_fffffffffffffed8);
        CMU462::operator*(&in_stack_fffffffffffffd48->x,in_stack_fffffffffffffd40);
        pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                           ((_List_iterator<CMU462::Vertex> *)in_stack_fffffffffffffd40);
        Vector3D::operator+=(&pVVar7->position,&local_68);
        local_90 = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(local_48,0);
      }
    }
    local_98._M_node = (_List_node_base *)HalfedgeMesh::facesBegin(in_stack_fffffffffffffd38);
    while( true ) {
      local_a0._M_node = (_List_node_base *)HalfedgeMesh::facesEnd(in_stack_fffffffffffffd38);
      bVar1 = std::operator!=(&local_98,&local_a0);
      if (!bVar1) break;
      pFVar2 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffd40);
      (**(pFVar2->super_HalfedgeElement)._vptr_HalfedgeElement)(local_b8);
      pFVar2 = std::_List_iterator<CMU462::Face>::operator->
                         ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffd40);
      pHVar3 = Face::halfedge(pFVar2);
      local_c0._M_node = pHVar3->_M_node;
      do {
        local_c8 = local_c0._M_node;
        pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd40);
        pHVar3 = Halfedge::next(pHVar4);
        local_d0 = pHVar3->_M_node;
        Vector3D::Vector3D(&local_e8);
        Vector3D::Vector3D((Vector3D *)&stack0xffffffffffffff00);
        Vector3D::Vector3D((Vector3D *)&stack0xfffffffffffffee8);
        Vector3D::Vector3D((Vector3D *)local_130);
        Vector3D::Vector3D(&local_148);
        Vector3D::Vector3D(&local_160);
        Vector3D::Vector3D(&local_178);
        Vector3D::Vector3D(&local_190);
        Vector3D::Vector3D(&local_1a8);
        Vector3D::Vector3D(&local_1c0);
        std::_List_iterator<CMU462::Halfedge>::operator->
                  ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd40);
        Halfedge::getPickPoints
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        std::_List_iterator<CMU462::Halfedge>::operator->
                  ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd40);
        Halfedge::getPickPoints
                  (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        glBegin(4);
        pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd40);
        pVVar5 = Halfedge::vertex(pHVar4);
        local_1c8 = pVVar5->_M_node;
        elementAddress((VertexIter)0x2020ad);
        newPickElement(in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58,
                       (HalfedgeElement *)in_stack_fffffffffffffd50._M_node);
        glVertex3dv(&local_e8);
        glVertex3dv(&stack0xfffffffffffffee8);
        glVertex3dv(&local_148);
        local_1d0 = local_98._M_node;
        elementAddress((FaceIter)0x202124);
        newPickElement(in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58,
                       (HalfedgeElement *)in_stack_fffffffffffffd50._M_node);
        glVertex3dv(&stack0xffffffffffffff00);
        glVertex3dv(&local_178);
        glVertex3dv(local_b8);
        glEnd();
        glBegin(7);
        pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd40);
        pEVar6 = Halfedge::edge(pHVar4);
        local_1d8 = pEVar6->_M_node;
        elementAddress((EdgeIter)0x2021ca);
        newPickElement(in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58,
                       (HalfedgeElement *)in_stack_fffffffffffffd50._M_node);
        glVertex3dv(&stack0xfffffffffffffee8);
        glVertex3dv(&local_1c0);
        glVertex3dv(&local_1a8);
        glVertex3dv(local_130);
        local_1e0 = local_d0;
        elementAddress((HalfedgeIter)0x202250);
        newPickElement(in_stack_fffffffffffffd60,(int *)in_stack_fffffffffffffd58,
                       (HalfedgeElement *)in_stack_fffffffffffffd50._M_node);
        glVertex3dv(local_130);
        glVertex3dv(&local_1a8);
        glVertex3dv(&local_178);
        glVertex3dv(&stack0xffffffffffffff00);
        glEnd();
        pHVar4 = std::_List_iterator<CMU462::Halfedge>::operator->
                           ((_List_iterator<CMU462::Halfedge> *)in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd60 = (Mesh *)Halfedge::next(pHVar4);
        local_c0._M_node =
             (_List_node_base *)(in_stack_fffffffffffffd60->super_SceneObject)._vptr_SceneObject;
        pFVar2 = std::_List_iterator<CMU462::Face>::operator->
                           ((_List_iterator<CMU462::Face> *)in_stack_fffffffffffffd40);
        in_stack_fffffffffffffd58 = Face::halfedge(pFVar2);
        bVar1 = std::operator!=(&local_c0,in_stack_fffffffffffffd58);
      } while (bVar1);
      local_1e8 = (_List_node_base *)std::_List_iterator<CMU462::Face>::operator++(&local_98,0);
    }
    if ((local_11 & 1) != 0) {
      glPopMatrix();
      local_1ec = 0;
      in_stack_fffffffffffffd50 = HalfedgeMesh::verticesBegin(in_stack_fffffffffffffd38);
      local_1f8._M_node = in_stack_fffffffffffffd50._M_node;
      while( true ) {
        local_200._M_node = (_List_node_base *)HalfedgeMesh::verticesEnd(in_stack_fffffffffffffd38);
        bVar1 = std::operator!=(&local_1f8,&local_200);
        if (!bVar1) break;
        __n = (size_type)local_1ec;
        local_1ec = local_1ec + 1;
        this_00 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                            (&local_30,__n);
        pVVar7 = std::_List_iterator<CMU462::Vertex>::operator->
                           ((_List_iterator<CMU462::Vertex> *)this_00);
        (pVVar7->position).x = this_00->x;
        (pVVar7->position).y = this_00->y;
        (pVVar7->position).z = this_00->z;
        std::_List_iterator<CMU462::Vertex>::operator++(&local_1f8,0);
      }
    }
    std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::~vector
              ((vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *)
               in_stack_fffffffffffffd50._M_node);
  }
  return;
}

Assistant:

void Mesh::draw_pick(int &pickID, bool transformed) {
  idToElement.clear();
  if (isGhosted) return;
  vector<Vector3D> originalPositions;

  if (transformed) {
    glPushMatrix();
    glTranslatef(position.x, position.y, position.z);
    glRotatef(rotation.x, 1.0f, 0.0f, 0.0f);
    glRotatef(rotation.y, 0.0f, 1.0f, 0.0f);
    glRotatef(rotation.z, 0.0f, 0.0f, 1.0f);
    glScalef(scale.x, scale.y, scale.z);
    for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
      originalPositions.push_back(v->position);
      v->position += v->offset * v->normal();
    }
  }

  for (FaceIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {
    Vector3D c = f->centroid();

    HalfedgeIter h = f->halfedge();
    do {
      HalfedgeIter h1 = h;
      HalfedgeIter h2 = h->next();

      Vector3D a1, b1, p1, q1, r1;
      Vector3D a2, b2, p2, q2, r2;

      h1->getPickPoints(a1, b1, p1, q1, r1);
      h2->getPickPoints(a2, b2, p2, q2, r2);

      glBegin(GL_TRIANGLES);

      // vertex
      newPickElement(pickID, elementAddress(h2->vertex()));
      glVertex3dv(&a1.x);
      glVertex3dv(&p1.x);
      glVertex3dv(&r1.x);

      // face
      newPickElement(pickID, elementAddress(f));
      glVertex3dv(&b1.x);
      glVertex3dv(&b2.x);
      glVertex3dv(&c.x);

      glEnd();

      glBegin(GL_QUADS);

      // edge
      newPickElement(pickID, elementAddress(h2->edge()));
      glVertex3dv(&p1.x);
      glVertex3dv(&r2.x);
      glVertex3dv(&q2.x);
      glVertex3dv(&q1.x);

      // halfedge
      newPickElement(pickID, elementAddress(h2));
      glVertex3dv(&q1.x);
      glVertex3dv(&q2.x);
      glVertex3dv(&b2.x);
      glVertex3dv(&b1.x);

      glEnd();

      h = h->next();
    } while (h != f->halfedge());
  }

  if (transformed) {
    glPopMatrix();
    int i = 0;
    for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
      v->position = originalPositions[i++];
    }
  }
}